

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O0

lzma_ret lzma_stream_encoder_init
                   (lzma_next_coder_conflict2 *next,lzma_allocator *allocator,lzma_filter *filters,
                   lzma_check check)

{
  lzma_coder_conflict2 *plVar1;
  lzma_index *plVar2;
  undefined1 local_68 [4];
  lzma_ret ret_;
  lzma_stream_flags stream_flags;
  lzma_check check_local;
  lzma_filter *filters_local;
  lzma_allocator *allocator_local;
  lzma_next_coder_conflict2 *next_local;
  
  stream_flags._52_4_ = check;
  memset(local_68,0,0x38);
  stream_flags.backward_size._0_4_ = stream_flags._52_4_;
  if ((code *)next->init != lzma_stream_encoder_init) {
    lzma_next_end((lzma_next_coder *)next,allocator);
  }
  next->init = (uintptr_t)lzma_stream_encoder_init;
  if (filters == (lzma_filter *)0x0) {
    next_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    if (next->coder == (lzma_coder_conflict2 *)0x0) {
      plVar1 = (lzma_coder_conflict2 *)lzma_alloc(0x5c0,allocator);
      next->coder = plVar1;
      if (next->coder == (lzma_coder_conflict2 *)0x0) {
        return LZMA_MEM_ERROR;
      }
      next->code = stream_encode;
      next->end = stream_encoder_end;
      next->update = stream_encoder_update;
      next->coder->filters[0].id = 0xffffffffffffffff;
      memcpy(&next->coder->block_encoder,&LZMA_NEXT_CODER_INIT,0x40);
      memcpy(&next->coder->index_encoder,&LZMA_NEXT_CODER_INIT,0x40);
      next->coder->index = (lzma_index *)0x0;
    }
    next->coder->sequence = SEQ_HEADER;
    (next->coder->block_options).version = 0;
    (next->coder->block_options).check = stream_flags._52_4_;
    lzma_index_end(next->coder->index,allocator);
    plVar2 = lzma_index_init(allocator);
    next->coder->index = plVar2;
    if (next->coder->index == (lzma_index *)0x0) {
      next_local._4_4_ = LZMA_MEM_ERROR;
    }
    else {
      next_local._4_4_ =
           lzma_stream_header_encode((lzma_stream_flags *)local_68,next->coder->buffer);
      if (next_local._4_4_ == LZMA_OK) {
        next->coder->buffer_pos = 0;
        next->coder->buffer_size = 0xc;
        next_local._4_4_ = stream_encoder_update(next->coder,allocator,filters,(lzma_filter *)0x0);
      }
    }
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_stream_encoder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_filter *filters, lzma_check check)
{
	lzma_stream_flags stream_flags = { 0, 0, check };

	lzma_next_coder_init(&lzma_stream_encoder_init, next, allocator);

	if (filters == NULL)
		return LZMA_PROG_ERROR;

	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &stream_encode;
		next->end = &stream_encoder_end;
		next->update = &stream_encoder_update;

		next->coder->filters[0].id = LZMA_VLI_UNKNOWN;
		next->coder->block_encoder = LZMA_NEXT_CODER_INIT;
		next->coder->index_encoder = LZMA_NEXT_CODER_INIT;
		next->coder->index = NULL;
	}

	// Basic initializations
	next->coder->sequence = SEQ_STREAM_HEADER;
	next->coder->block_options.version = 0;
	next->coder->block_options.check = check;

	// Initialize the Index
	lzma_index_end(next->coder->index, allocator);
	next->coder->index = lzma_index_init(allocator);
	if (next->coder->index == NULL)
		return LZMA_MEM_ERROR;

	// Encode the Stream Header
	return_if_error(lzma_stream_header_encode(
			&stream_flags, next->coder->buffer));

	next->coder->buffer_pos = 0;
	next->coder->buffer_size = LZMA_STREAM_HEADER_SIZE;

	// Initialize the Block encoder. This way we detect unsupported
	// filter chains when initializing the Stream encoder instead of
	// giving an error after Stream Header has already written out.
	return stream_encoder_update(
			next->coder, allocator, filters, NULL);
}